

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

Fra_Sml_t * Fra_SmlStart(Aig_Man_t *pAig,int nPref,int nFrames,int nWordsFrame)

{
  Fra_Sml_t *__s;
  int iVar1;
  
  iVar1 = nFrames + nPref;
  __s = (Fra_Sml_t *)malloc((long)iVar1 * (long)nWordsFrame * 4 * (long)pAig->vObjs->nSize + 0x28);
  memset(__s,0,(long)iVar1 * (long)nWordsFrame * 4 + 0x28);
  __s->pAig = pAig;
  __s->nPref = nPref;
  __s->nFrames = iVar1;
  __s->nWordsFrame = nWordsFrame;
  __s->nWordsTotal = iVar1 * nWordsFrame;
  __s->nWordsPref = nWordsFrame * nPref;
  return __s;
}

Assistant:

Fra_Sml_t * Fra_SmlStart( Aig_Man_t * pAig, int nPref, int nFrames, int nWordsFrame )
{
    Fra_Sml_t * p;
    p = (Fra_Sml_t *)ABC_ALLOC( char, sizeof(Fra_Sml_t) + sizeof(unsigned) * Aig_ManObjNumMax(pAig) * (nPref + nFrames) * nWordsFrame );
    memset( p, 0, sizeof(Fra_Sml_t) + sizeof(unsigned) * (nPref + nFrames) * nWordsFrame );
    p->pAig        = pAig;
    p->nPref       = nPref;
    p->nFrames     = nPref + nFrames;
    p->nWordsFrame = nWordsFrame;
    p->nWordsTotal = (nPref + nFrames) * nWordsFrame;
    p->nWordsPref  = nPref * nWordsFrame;
    // constant 1 is initialized to 0 because we store values modulus phase (pObj->fPhase)
    return p;
}